

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
* __thiscall
cfd::core::DescriptorNode::GetReferences
          (vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument,DescriptorNode *parent)

{
  DescriptorScriptType *__args_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__args_3;
  ScriptOperator *pSVar1;
  pointer pbVar2;
  pointer pcVar3;
  undefined8 __last;
  bool bVar4;
  int iVar5;
  _func_int **pp_Var6;
  pointer puVar7;
  ScriptBuilder *pSVar8;
  long lVar9;
  unsigned_long uVar10;
  CfdException *pCVar11;
  pointer pbVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  pointer pDVar16;
  DescriptorKeyReference *this_00;
  pointer pbVar17;
  Pubkey pubkey;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_> keys
  ;
  Script locking_script;
  ScriptBuilder build;
  TapBranch branch;
  ScriptElement elem;
  pointer local_5e8;
  TapBranch local_5d0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_558;
  Script local_540;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_500 [10];
  Script script;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_280 [22];
  ByteData local_60;
  ByteData local_48;
  
  if ((array_argument !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) && (this->depth_ == 0)) {
    pbVar12 = (array_argument->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (array_argument->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((0x20 < (ulong)((long)pbVar2 - (long)pbVar12)) &&
       (pbVar17 = pbVar2 + -1, pbVar12 < pbVar17 && pbVar12 != pbVar2)) {
      do {
        ::std::__cxx11::string::swap((string *)pbVar12);
        pbVar12 = pbVar12 + 1;
        pbVar17 = pbVar17 + -1;
      } while (pbVar12 < pbVar17);
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  build._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_0025a9c8;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Script::Script(&locking_script);
  if (this->node_type_ != kDescriptorTypeScript) {
    if (this->node_type_ == kDescriptorTypeNumber) {
      ScriptElement::ScriptElement(&elem,(ulong)this->number_);
      ScriptBuilder::AppendElement(&build,&elem);
      ScriptElement::~ScriptElement(&elem);
    }
    goto LAB_001917b1;
  }
  __args_1 = &this->script_type_;
  switch(this->script_type_) {
  case kDescriptorScriptSh:
  case kDescriptorScriptWsh:
    GetReference((DescriptorScriptReference *)&elem,
                 (this->child_node_).
                 super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                 ._M_impl.super__Vector_impl_data._M_start,array_argument,this);
    Script::Script(&script,(Script *)&elem.type_);
    if (*__args_1 == kDescriptorScriptWsh) {
      ScriptUtil::CreateP2wshLockingScript((Script *)&branch,&script);
      Script::operator=(&locking_script,(Script *)&branch);
    }
    else {
      ScriptUtil::CreateP2shLockingScript((Script *)&branch,&script);
      Script::operator=(&locking_script,(Script *)&branch);
    }
    Script::~Script((Script *)&branch);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,(DescriptorScriptReference *)&elem
               ,&this->addr_prefixes_);
    Script::~Script(&script);
    DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)&elem);
    break;
  default:
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeyReferences((DescriptorKeyReference *)&script,
                     (this->child_node_).
                     super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                     ._M_impl.super__Vector_impl_data._M_start,array_argument);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    push_back(&keys,(value_type *)&script);
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar14 = (long)script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (uVar14 == 0) {
      puVar7 = (pointer)0x0;
    }
    else {
      if ((long)uVar14 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar7 = (pointer)operator_new(uVar14);
    }
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar7 + uVar14;
    sVar15 = (long)script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar7;
    if (sVar15 != 0) {
      pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
      memmove(puVar7,script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_start,sVar15);
    }
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7 + sVar15;
    switch(*__args_1) {
    case kDescriptorScriptPk:
      iVar5 = ::std::__cxx11::string::compare((char *)&this->parent_kind_);
      if (iVar5 == 0) {
        SchnorrPubkey::FromPubkey((SchnorrPubkey *)&branch,&pubkey,(bool *)0x0);
        SchnorrPubkey::GetData((ByteData *)&elem,(SchnorrPubkey *)&branch);
        pSVar8 = ScriptBuilder::operator<<(&build,(ByteData *)&elem);
        ScriptBuilder::operator<<(pSVar8,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
        if (elem._vptr_ScriptElement != (_func_int **)0x0) {
          operator_delete(elem._vptr_ScriptElement);
        }
        if (branch._vptr_TapBranch != (_func_int **)0x0) {
          operator_delete(branch._vptr_TapBranch);
        }
      }
      else {
        pSVar8 = ScriptBuilder::operator<<(&build,&pubkey);
        ScriptBuilder::operator<<(pSVar8,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
      }
      ScriptBuilder::Build((Script *)&elem,&build);
      Script::operator=(&locking_script,(Script *)&elem);
      break;
    case kDescriptorScriptPkh:
      ScriptUtil::CreateP2pkhLockingScript((Script *)&elem,&pubkey);
      Script::operator=(&locking_script,(Script *)&elem);
      break;
    case kDescriptorScriptWpkh:
      ScriptUtil::CreateP2wpkhLockingScript((Script *)&elem,&pubkey);
      Script::operator=(&locking_script,(Script *)&elem);
      break;
    case kDescriptorScriptCombo:
      bVar4 = Pubkey::IsCompress(&pubkey);
      if (bVar4) {
        ScriptUtil::CreateP2wpkhLockingScript((Script *)&elem,&pubkey);
        Script::operator=(&locking_script,(Script *)&elem);
        Script::~Script((Script *)&elem);
        __args_3 = &this->addr_prefixes_;
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,&locking_script,__args_1,&keys,__args_3);
        DescriptorScriptReference::DescriptorScriptReference
                  ((DescriptorScriptReference *)&elem,&locking_script,kDescriptorScriptWpkh,&keys,
                   __args_3,0);
        ScriptUtil::CreateP2shLockingScript((Script *)&branch,&locking_script);
        Script::operator=(&locking_script,(Script *)&branch);
        Script::~Script((Script *)&branch);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,&locking_script,__args_1,
                   (DescriptorScriptReference *)&elem,__args_3);
        DescriptorScriptReference::~DescriptorScriptReference((DescriptorScriptReference *)&elem);
      }
      ScriptUtil::CreateP2pkhLockingScript((Script *)&elem,&pubkey);
      Script::operator=(&locking_script,(Script *)&elem);
      Script::~Script((Script *)&elem);
      ::std::
      vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
      ::
      emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                  *)__return_storage_ptr__,&locking_script,__args_1,&keys,&this->addr_prefixes_);
      pSVar8 = ScriptBuilder::operator<<(&build,&pubkey);
      ScriptBuilder::operator<<(pSVar8,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
      ScriptBuilder::Build((Script *)&elem,&build);
      Script::operator=(&locking_script,(Script *)&elem);
      Script::~Script((Script *)&elem);
    default:
      goto switchD_001920d7_default;
    }
    Script::~Script((Script *)&elem);
switchD_001920d7_default:
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&keys,&this->addr_prefixes_);
    if (pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    this_00 = (DescriptorKeyReference *)&script;
LAB_001925e7:
    DescriptorKeyReference::~DescriptorKeyReference(this_00);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&keys);
    break;
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           ((this->child_node_).
                            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                            ._M_impl.super__Vector_impl_data._M_start)->number_);
    branch.script_._vptr_Script = (_func_int **)0x0;
    branch._vptr_TapBranch = (_func_int **)0x0;
    branch.has_leaf_ = false;
    branch.leaf_version_ = '\0';
    branch._10_6_ = 0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    DescriptorKeyReference::DescriptorKeyReference((DescriptorKeyReference *)&elem);
    pDVar16 = (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->child_node_).
                           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar16 >> 3) *
                   0x4fa4fa4fa4fa4fa5)) {
      uVar14 = 1;
      lVar9 = 0x168;
      do {
        GetKeyReferences((DescriptorKeyReference *)&script,
                         (DescriptorNode *)((long)&(pDVar16->name_)._M_dataplus._M_p + lVar9),
                         array_argument);
        DescriptorKeyReference::operator=
                  ((DescriptorKeyReference *)&elem,(DescriptorKeyReference *)&script);
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&script);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::push_back(&keys,(DescriptorKeyReference *)&elem);
        script._vptr_Script = (_func_int **)0x0;
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar13 = elem.op_code_.text_data_._M_string_length -
                 (long)elem.op_code_.text_data_._M_dataplus._M_p;
        if (uVar13 == 0) {
          pp_Var6 = (_func_int **)0x0;
        }
        else {
          if ((long)uVar13 < 0) {
            ::std::__throw_bad_alloc();
          }
          pp_Var6 = (_func_int **)operator_new(uVar13);
        }
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar13 + (long)pp_Var6);
        sVar15 = elem.op_code_.text_data_._M_string_length -
                 (long)elem.op_code_.text_data_._M_dataplus._M_p;
        script._vptr_Script = pp_Var6;
        if (sVar15 != 0) {
          script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pp_Var6;
          memmove(pp_Var6,elem.op_code_.text_data_._M_dataplus._M_p,sVar15);
        }
        script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)((long)pp_Var6 + sVar15);
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
        emplace_back<cfd::core::Pubkey>
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&branch,
                   (Pubkey *)&script);
        if (script._vptr_Script != (_func_int **)0x0) {
          operator_delete(script._vptr_Script);
        }
        uVar14 = uVar14 + 1;
        pDVar16 = (this->child_node_).
                  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0x168;
      } while (uVar14 < (ulong)(((long)(this->child_node_).
                                       super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar16 >>
                                3) * 0x4fa4fa4fa4fa4fa5));
    }
    __last = branch._8_8_;
    pp_Var6 = branch._vptr_TapBranch;
    if ((*__args_1 == kDescriptorScriptSortedMulti) &&
       (branch._vptr_TapBranch != (_func_int **)branch._8_8_)) {
      uVar14 = (branch._8_8_ - (long)branch._vptr_TapBranch >> 3) * -0x5555555555555555;
      lVar9 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cfd::core::Pubkey_const&,cfd::core::Pubkey_const&)>>
                ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  )branch._vptr_TapBranch,
                 (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  )branch._8_8_,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_cfd::core::Pubkey_&,_const_cfd::core::Pubkey_&)>)
                 Pubkey::IsLarge);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cfd::core::Pubkey_const&,cfd::core::Pubkey_const&)>>
                ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  )pp_Var6,
                 (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                  )__last,(_Iter_comp_iter<bool_(*)(const_cfd::core::Pubkey_&,_const_cfd::core::Pubkey_&)>
                           )Pubkey::IsLarge);
    }
    if (parent == (DescriptorNode *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = parent->script_type_ == kDescriptorScriptWsh;
    }
    ScriptUtil::CreateMultisigRedeemScript
              (&script,(uint32_t)
                       pubkey.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,
               (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&branch,bVar4);
    Script::operator=(&locking_script,&script);
    Script::~Script(&script);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&,unsigned_int&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&keys,&this->addr_prefixes_,
               (uint *)&pubkey);
    DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&elem);
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&keys);
    ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&branch);
    break;
  case kDescriptorScriptAddr:
    core::Address::Address((Address *)&elem,&this->value_,&this->addr_prefixes_);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Address&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,(Address *)&elem,&this->addr_prefixes_);
    core::Address::GetLockingScript(&script,(Address *)&elem);
    Script::operator=(&locking_script,&script);
    Script::~Script(&script);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_500);
    Script::~Script(&local_540);
    local_5d0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0025af68;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_558);
    TapBranch::~TapBranch(&local_5d0);
    if (local_5e8 != (pointer)0x0) {
      operator_delete(local_5e8);
    }
    if (elem.binary_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(elem.binary_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    if (elem.op_code_.text_data_.field_2._M_allocated_capacity != 0) {
      operator_delete((void *)elem.op_code_.text_data_.field_2._M_allocated_capacity);
    }
    if ((string *)elem.op_code_._vptr_ScriptOperator == &elem.op_code_.text_data_) break;
    goto LAB_00192500;
  case kDescriptorScriptRaw:
    Script::Script((Script *)&elem,&this->value_);
    Script::operator=(&locking_script,(Script *)&elem);
    Script::~Script((Script *)&elem);
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&this->addr_prefixes_);
    break;
  case kDescriptorScriptMiniscript:
    uVar10 = 0;
    if (this->need_arg_num_ != 0) {
      if ((array_argument ==
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) ||
         (pbVar12 = (array_argument->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
         pbVar12 ==
         (array_argument->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish)) {
        elem._vptr_ScriptElement = (_func_int **)0x21b4ee;
        elem.type_ = 0x662;
        elem.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_f31a1;
        logger::log<>((CfdSourceLocation *)&elem,kCfdLogLevelWarning,
                      "Failed to generate miniscript from hdkey.");
        pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
        elem._vptr_ScriptElement = (_func_int **)&elem.op_code_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&elem,"Failed to generate miniscript from hdkey.","");
        CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&elem);
        __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
      }
      elem._vptr_ScriptElement = (_func_int **)&elem.op_code_;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&elem,"base","");
      sVar15 = pbVar12->_M_string_length;
      bVar4 = true;
      if (sVar15 == CONCAT44(elem._12_4_,elem.type_)) {
        if (sVar15 == 0) {
          bVar4 = false;
        }
        else {
          iVar5 = bcmp((pbVar12->_M_dataplus)._M_p,elem._vptr_ScriptElement,sVar15);
          bVar4 = iVar5 != 0;
        }
      }
      pSVar1 = &elem.op_code_;
      if ((ScriptOperator *)elem._vptr_ScriptElement != pSVar1) {
        operator_delete(elem._vptr_ScriptElement);
      }
      if (bVar4) {
        pbVar12 = (array_argument->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pcVar3 = pbVar12[-1]._M_dataplus._M_p;
        elem._vptr_ScriptElement = (_func_int **)pSVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&elem,pcVar3,pcVar3 + pbVar12[-1]._M_string_length);
        pbVar12 = (array_argument->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        (array_argument->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar12 + -1;
        pcVar3 = pbVar12[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &pbVar12[-1].field_2) {
          operator_delete(pcVar3);
        }
        lVar9 = ::std::__cxx11::string::rfind((char *)&elem,0x219a0d,0xffffffffffffffff);
        if (lVar9 != -1) {
          script._vptr_Script = (_func_int **)0x21b4ee;
          script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(script.script_data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x66f);
          script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "GetReferences";
          logger::log<>((CfdSourceLocation *)&script,kCfdLogLevelWarning,
                        "Failed to invalid argument. miniscript is single child.");
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          script._vptr_Script =
               (_func_int **)
               &script.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&script,"Failed to invalid argument. miniscript is single child.","")
          ;
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&script);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
        branch._vptr_TapBranch = (_func_int **)0x0;
        uVar10 = ::std::__cxx11::stoul((string *)&elem,(size_t *)&branch,10);
        if ((branch._vptr_TapBranch != (_func_int **)0x0) &&
           (branch._vptr_TapBranch < (_func_int **)CONCAT44(elem._12_4_,elem.type_))) {
          script._vptr_Script = (_func_int **)0x21b4ee;
          script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(script.script_data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x678);
          script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "GetReferences";
          logger::log<>((CfdSourceLocation *)&script,kCfdLogLevelWarning,
                        "Failed to invalid argument. number only.");
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          script._vptr_Script =
               (_func_int **)
               &script.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&script,"Failed to invalid argument. number only.","");
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&script);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if ((ScriptOperator *)elem._vptr_ScriptElement != pSVar1) {
          operator_delete(elem._vptr_ScriptElement);
        }
      }
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script,(ulong)this->number_
               ,(allocator_type *)&elem);
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    iVar5 = ::std::__cxx11::string::compare((char *)&this->parent_kind_);
    iVar5 = wally_descriptor_parse_miniscript
                      ((this->value_)._M_dataplus._M_p,0,0,0,uVar10 & 0xffffffff,iVar5 == 0,
                       script._vptr_Script,
                       (long)script.script_data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)script._vptr_Script,
                       &keys);
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,iVar5);
    if ((iVar5 != 0) ||
       ((pointer)(script.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + -(long)script._vptr_Script) <
        keys.
        super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      elem._vptr_ScriptElement = (_func_int **)0x21b4ee;
      elem.type_ = 0x68a;
      elem.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_f31a1;
      logger::log<int&,unsigned_long&>
                ((CfdSourceLocation *)&elem,kCfdLogLevelWarning,
                 "Failed to parse miniscript.({}, size:{})",(int *)&pubkey,(unsigned_long *)&keys);
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      elem._vptr_ScriptElement = (_func_int **)&elem.op_code_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&elem,"Failed to parse miniscript.","");
      CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&elem);
      __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)&branch,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
    Script::Script((Script *)&elem,(ByteData *)&branch);
    Script::operator=(&locking_script,(Script *)&elem);
    Script::~Script((Script *)&elem);
    if (branch._vptr_TapBranch != (_func_int **)0x0) {
      operator_delete(branch._vptr_TapBranch);
    }
    ::std::
    vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
    ::
    emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
              ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                *)__return_storage_ptr__,&locking_script,__args_1,&this->addr_prefixes_);
    elem.op_code_._vptr_ScriptOperator = script._vptr_Script;
    if (script._vptr_Script == (_func_int **)0x0) break;
LAB_00192500:
    operator_delete(elem.op_code_._vptr_ScriptOperator);
    break;
  case kDescriptorScriptTaproot:
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeyReferences((DescriptorKeyReference *)&elem,
                     (this->child_node_).
                     super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                     ._M_impl.super__Vector_impl_data._M_start,array_argument);
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar14 = (long)elem.op_code_._vptr_ScriptOperator - CONCAT44(elem._12_4_,elem.type_);
    if (uVar14 == 0) {
      puVar7 = (pointer)0x0;
    }
    else {
      if ((long)uVar14 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar7 = (pointer)operator_new(uVar14);
    }
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar7 + uVar14;
    sVar15 = (long)elem.op_code_._vptr_ScriptOperator - (long)CONCAT44(elem._12_4_,elem.type_);
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar7;
    if (sVar15 != 0) {
      pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
      memmove(puVar7,(void *)CONCAT44(elem._12_4_,elem.type_),sVar15);
    }
    pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7 + sVar15;
    ::std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    push_back(&keys,(value_type *)&elem);
    TapBranch::TapBranch(&branch);
    pDVar16 = (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->child_node_).
                           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar16 >> 3) *
                   0x4fa4fa4fa4fa4fa5)) {
      GetTapBranch((TapBranch *)&script,pDVar16 + 1,array_argument);
      TapBranch::operator=(&branch,(TapBranch *)&script);
      TapBranch::~TapBranch((TapBranch *)&script);
    }
    bVar4 = TapBranch::HasTapLeaf(&branch);
    if (bVar4) {
      TaprootScriptTree::TaprootScriptTree((TaprootScriptTree *)&script,&branch);
      TaprootUtil::CreateTapScriptControl
                (&local_48,(SchnorrPubkey *)&pubkey,(TapBranch *)&script,(SchnorrPubkey *)0x0,
                 &locking_script);
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
      ::
      emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TaprootScriptTree&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                  *)__return_storage_ptr__,&locking_script,__args_1,&keys,
                 (TaprootScriptTree *)&script,&this->addr_prefixes_);
      script._vptr_Script = (_func_int **)&PTR__TaprootScriptTree_0025af68;
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (local_280);
      TapBranch::~TapBranch((TapBranch *)&script);
    }
    else {
      TaprootUtil::CreateTapScriptControl
                (&local_60,(SchnorrPubkey *)&pubkey,&branch,(SchnorrPubkey *)0x0,&locking_script);
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
      ::
      emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TapBranch&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                  *)__return_storage_ptr__,&locking_script,__args_1,&keys,&branch,
                 &this->addr_prefixes_);
    }
    TapBranch::~TapBranch(&branch);
    if (pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    this_00 = (DescriptorKeyReference *)&elem;
    goto LAB_001925e7;
  }
LAB_001917b1:
  Script::~Script(&locking_script);
  build._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_0025a9c8;
  if (build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(build.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DescriptorScriptReference> DescriptorNode::GetReferences(
    std::vector<std::string>* array_argument,
    const DescriptorNode* parent) const {
  if ((depth_ == 0) && (array_argument) && (array_argument->size() > 1)) {
    std::reverse(array_argument->begin(), array_argument->end());
  }
  std::vector<DescriptorScriptReference> result;
  ScriptBuilder build;
  Script locking_script;

  if (node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
    // do nothing
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
    ScriptElement elem(static_cast<int64_t>(number_));
    build.AppendElement(elem);
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeScript) {
    if (script_type_ == DescriptorScriptType::kDescriptorScriptMiniscript) {
      uint32_t child_num = 0;
      if (need_arg_num_ == 0) {
        // do nothing
      } else if ((array_argument == nullptr) || array_argument->empty()) {
        warn(CFD_LOG_SOURCE, "Failed to generate miniscript from hdkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to generate miniscript from hdkey.");
      } else if (
          (array_argument != nullptr) && (!array_argument->empty()) &&
          (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
        // do nothing
      } else if (array_argument != nullptr) {
        std::string arg_value = array_argument->back();
        array_argument->pop_back();
        if (arg_value.rfind("/") != std::string::npos) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to invalid argument. miniscript is single child.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. miniscript is single child.");
        }
        std::size_t end_pos = 0;
        child_num = static_cast<uint32_t>(std::stoul(arg_value, &end_pos, 10));
        if ((end_pos != 0) && (end_pos < arg_value.size())) {
          warn(CFD_LOG_SOURCE, "Failed to invalid argument. number only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. number only.");
        }
      }
      std::vector<uint8_t> script(number_);
      size_t written = 0;
      uint32_t flags = 0;
      if (parent_kind_ == "tr") flags = WALLY_MINISCRIPT_TAPSCRIPT;
      int ret = wally_descriptor_parse_miniscript(
          value_.c_str(), nullptr, nullptr, 0, child_num, flags, script.data(),
          script.size(), &written);
      if ((ret == WALLY_OK) && (written <= script.size())) {
        locking_script = Script(script);
        result.emplace_back(locking_script, script_type_, addr_prefixes_);
      } else {
        warn(
            CFD_LOG_SOURCE, "Failed to parse miniscript.({}, size:{})", ret,
            written);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Failed to parse miniscript.");
      }
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptRaw) {
      locking_script = Script(value_);
      result.emplace_back(locking_script, script_type_, addr_prefixes_);
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptAddr) {
      Address addr(value_, addr_prefixes_);
      result.emplace_back(addr, addr_prefixes_);
      locking_script = addr.GetLockingScript();
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptMulti) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti)) {
      uint32_t reqnum = child_node_[0].number_;
      std::vector<Pubkey> pubkeys;
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference key_ref;
      for (size_t index = 1; index < child_node_.size(); ++index) {
        key_ref = child_node_[index].GetKeyReferences(array_argument);
        keys.push_back(key_ref);
        pubkeys.push_back(key_ref.GetPubkey());
      }
      if (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti) {
        // https://github.com/bitcoin/bips/blob/master/bip-0067.mediawiki
        std::sort(pubkeys.begin(), pubkeys.end(), Pubkey::IsLarge);
      }
      bool has_witness = false;
      if ((parent != nullptr) &&
          (parent->GetScriptType() ==
           DescriptorScriptType::kDescriptorScriptWsh)) {
        has_witness = true;
      }
      locking_script =
          ScriptUtil::CreateMultisigRedeemScript(reqnum, pubkeys, has_witness);
      result.emplace_back(
          locking_script, script_type_, keys, addr_prefixes_, reqnum);
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptSh) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptWsh)) {
      DescriptorScriptReference ref =
          child_node_[0].GetReference(array_argument, this);
      Script script = ref.GetLockingScript();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
        locking_script = ScriptUtil::CreateP2wshLockingScript(script);
      } else {
        locking_script = ScriptUtil::CreateP2shLockingScript(script);
      }
      result.emplace_back(locking_script, script_type_, ref, addr_prefixes_);
    } else if (
        script_type_ == DescriptorScriptType::kDescriptorScriptTaproot) {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      SchnorrPubkey pubkey = ref.GetSchnorrPubkey();
      keys.push_back(ref);
      TapBranch branch;
      if (child_node_.size() >= 2) {
        branch = child_node_[1].GetTapBranch(array_argument);
      }
      if (branch.HasTapLeaf()) {
        TaprootScriptTree tree(branch);
        TaprootUtil::CreateTapScriptControl(
            pubkey, tree, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, tree, addr_prefixes_);
      } else {
        TaprootUtil::CreateTapScriptControl(
            pubkey, branch, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, branch, addr_prefixes_);
      }
    } else {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      keys.push_back(ref);
      Pubkey pubkey = ref.GetPubkey();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptCombo) {
        if (pubkey.IsCompress()) {
          // p2wpkh
          locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
          result.emplace_back(
              locking_script, script_type_, keys, addr_prefixes_);

          // p2sh-p2wpkh
          DescriptorScriptReference child_script(
              locking_script, DescriptorScriptType::kDescriptorScriptWpkh,
              keys, addr_prefixes_);
          locking_script = ScriptUtil::CreateP2shLockingScript(locking_script);
          result.emplace_back(
              locking_script, script_type_, child_script, addr_prefixes_);
        }

        // p2pkh
        locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);

        // p2pk
        build << pubkey << ScriptOperator::OP_CHECKSIG;
        locking_script = build.Build();
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);
      } else {
        if (script_type_ == DescriptorScriptType::kDescriptorScriptPkh) {
          locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
        } else if (
            script_type_ == DescriptorScriptType::kDescriptorScriptWpkh) {
          locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
        } else if (script_type_ == DescriptorScriptType::kDescriptorScriptPk) {
          if (parent_kind_ == "tr") {
            build << SchnorrPubkey::FromPubkey(pubkey).GetData()
                  << ScriptOperator::OP_CHECKSIG;
          } else {
            build << pubkey << ScriptOperator::OP_CHECKSIG;
          }
          locking_script = build.Build();
        }
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);
      }
    }
  } else {
    // do nothing
  }

  return result;
}